

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

uint64_t libcellml::ulpsDistance(double a,double b)

{
  uint64_t uVar1;
  
  uVar1 = 0xffffffffffffffff;
  if ((!NAN(a) && !NAN(b)) && ((ABS(b) == INFINITY) == (ABS(a) == INFINITY))) {
    uVar1 = (long)a - (long)b;
    if ((ulong)a < (ulong)b) {
      uVar1 = -((long)a - (long)b);
    }
  }
  return uVar1;
}

Assistant:

uint64_t ulpsDistance(double a, double b)
{
    static const auto max = std::numeric_limits<uint64_t>::max();

    // Max distance for NaN.
    if (std::isnan(a) || std::isnan(b)) {
        return max;
    }

    // If one's infinite and they're not equal, max distance.
    if (std::isinf(a) != std::isinf(b)) {
        return max;
    }

    static const int SIZE_OF_DOUBLE = sizeof(double);

    uint64_t ia;
    uint64_t ib;
    memcpy(&ia, &a, SIZE_OF_DOUBLE);
    memcpy(&ib, &b, SIZE_OF_DOUBLE);

    // Return the absolute value of the distance in ULPs.
    uint64_t distance = max;
    if (ia < ib) {
        distance = ib + ~ia + 1;
    } else {
        distance = ia + ~ib + 1;
    }
    return distance;
}